

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx_main.c
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *in_RAX;
  ps_config_t *config;
  char *pcVar4;
  FILE *pFVar5;
  size_t sVar6;
  char *pcVar7;
  size_t sVar8;
  ps_decoder_t *ps;
  void *ptr;
  char *pcVar9;
  char **ppcVar10;
  ulong uVar11;
  uint uVar12;
  code *func;
  uint ninputs;
  long lVar13;
  ulong uVar14;
  int iVar15;
  char **inputs;
  
  pcVar9 = "live";
  if (1 < argc) {
    lVar13 = 1;
    iVar15 = -2;
    do {
      pcVar9 = argv[lVar13];
      bVar1 = true;
      if (((pcVar9 != (char *)0x0) && (*pcVar9 != '\0')) && (*pcVar9 != '-')) {
        memmove(argv + lVar13,argv + lVar13 + 1,(long)(argc + iVar15) << 3);
        argc = argc + -1;
        bVar1 = false;
        in_RAX = pcVar9;
      }
      pcVar9 = in_RAX;
      if (!bVar1) break;
      lVar13 = lVar13 + 2;
      iVar15 = iVar15 + -2;
      pcVar9 = "live";
    } while ((int)lVar13 < argc);
  }
  if (argc < 2) {
    ninputs = 0;
    inputs = (char **)0x0;
  }
  else {
    uVar12 = 1;
    ninputs = 0;
    inputs = (char **)0x0;
    do {
      pcVar4 = argv[(int)uVar12];
      if (((pcVar4 == (char *)0x0) || (*pcVar4 == '\0')) ||
         ((*pcVar4 == '-' && (pcVar4[1] != '\0')))) {
        uVar12 = uVar12 + 2;
      }
      else {
        memmove(argv + (int)uVar12,argv + (int)uVar12 + 1,(long)(int)(~uVar12 + argc) << 3);
        lVar13 = (long)argc;
        argc = argc + -1;
        inputs = argv + lVar13 + -1;
        *inputs = pcVar4;
        ninputs = ninputs + 1;
      }
    } while ((int)uVar12 < argc);
  }
  if (1 < (int)ninputs) {
    ppcVar10 = inputs + ninputs;
    uVar11 = 0;
    do {
      ppcVar10 = ppcVar10 + -1;
      pcVar4 = inputs[uVar11];
      inputs[uVar11] = *ppcVar10;
      *ppcVar10 = pcVar4;
      uVar11 = uVar11 + 1;
    } while (ninputs >> 1 != uVar11);
  }
  if ((((ninputs == 0) && (iVar15 = strcmp(pcVar9,"soxflags"), iVar15 != 0)) &&
      ((iVar15 = strcmp(pcVar9,"config"), iVar15 != 0 &&
       (iVar15 = strcmp(pcVar9,"help-config"), iVar15 != 0)))) ||
     (config = cmd_ln_parse_r((ps_config_t *)0x0,ps_main_args_def,argc,argv,0),
     config == (cmd_ln_t *)0x0)) {
    usage(*argv,0);
    return 1;
  }
  ps_default_search_args(config);
  iVar15 = ps_config_bool(config,"state_align");
  if (iVar15 != 0) {
    ps_config_set_bool(config,"phone_align",1);
  }
  pcVar4 = ps_config_str(config,"config");
  if (pcVar4 != (char *)0x0) {
    pFVar5 = fopen(pcVar4,"rt");
    if (pFVar5 == (FILE *)0x0) {
      err_msg_system(ERR_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_main.c"
                     ,0x305,"Failed to open config file %s",pcVar4);
LAB_00107ba1:
      bVar1 = false;
      iVar15 = 1;
    }
    else {
      fseek(pFVar5,0,2);
      sVar6 = ftell(pFVar5);
      fseek(pFVar5,0,0);
      pcVar7 = (char *)__ckd_malloc__(sVar6 + 1,
                                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_main.c"
                                      ,0x30b);
      sVar8 = fread(pcVar7,1,sVar6,pFVar5);
      if (sVar8 != sVar6) {
        err_msg_system(ERR_ERROR,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_main.c"
                       ,0x30d,"Failed to read config file %s",pcVar4);
        ckd_free(pcVar7);
        fclose(pFVar5);
        goto LAB_00107ba1;
      }
      pcVar7[sVar6] = '\0';
      fclose(pFVar5);
      config = ps_config_parse_json(config,pcVar7);
      ckd_free(pcVar7);
      iVar15 = 0;
      if (config == (ps_config_t *)0x0) {
        iVar15 = 1;
        config = (cmd_ln_t *)0x0;
        bVar1 = false;
      }
      else {
        ps_config_set_str(config,"config",(char *)0x0);
        bVar1 = true;
      }
    }
    if (!bVar1) {
      return iVar15;
    }
  }
  iVar15 = strcmp(pcVar9,"soxflags");
  if (iVar15 == 0) {
    ps_expand_model_config(config);
    uVar11 = ps_config_int(config,"samprate");
    iVar15 = snprintf((char *)0x0,0,"-r %d -c 1 -b 16 -e signed-integer -t raw -",
                      uVar11 & 0xffffffff);
    if (-1 < iVar15) {
      pcVar9 = (char *)__ckd_calloc__((ulong)(iVar15 + 1),1,
                                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_main.c"
                                      ,0x264);
      iVar3 = 0;
      iVar2 = snprintf(pcVar9,(ulong)(iVar15 + 1),"-r %d -c 1 -b 16 -e signed-integer -t raw -",
                       uVar11 & 0xffffffff);
      if (iVar2 == iVar15) {
        puts(pcVar9);
        fflush(_stdout);
        ckd_free(pcVar9);
      }
      else {
        err_msg_system(ERR_ERROR,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_main.c"
                       ,0x267,"Failed to snprintf()");
        iVar3 = -1;
      }
      goto LAB_00107dc4;
    }
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_main.c"
                   ,0x260,"Failed to snprintf()");
  }
  else {
    iVar15 = strcmp(pcVar9,"config");
    if (iVar15 != 0) {
      iVar15 = strcmp(pcVar9,"live");
      if (iVar15 == 0) {
        func = live;
      }
      else {
        iVar15 = strcmp(pcVar9,"single");
        if (iVar15 != 0) {
          iVar15 = strcmp(pcVar9,"align");
          if (iVar15 != 0) {
            iVar15 = strcmp(pcVar9,"help");
            if (iVar15 == 0) {
              iVar3 = 0;
              usage(*argv,0);
              goto LAB_00107dc4;
            }
            iVar15 = strcmp(pcVar9,"help-config");
            if (iVar15 != 0) {
              err_msg(ERR_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_main.c"
                      ,0x32d,"Unknown command \"%s\"\n",pcVar9);
              return 1;
            }
            usage(*argv,1);
            goto LAB_00107d42;
          }
          if ((int)ninputs < 2) {
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_main.c"
                    ,0x213,"Usage: pocketsphinx align INFILE TEXT...\n");
            goto LAB_00107d6e;
          }
          bVar1 = false;
          ps_config_set_bool(config,"bestpath",0);
          ps_config_set_str(config,"lm",(char *)0x0);
          pcVar9 = *inputs;
          iVar15 = strcmp(pcVar9,"-");
          if (iVar15 == 0) {
            bVar1 = true;
            pFVar5 = _stdin;
LAB_00107ea3:
            iVar3 = ps_config_soundfile(config,(FILE *)pFVar5,*inputs);
            if (iVar3 < 0) {
              ps = (ps_decoder_t *)0x0;
              pcVar9 = (char *)0x0;
            }
            else {
              ps = ps_init(config);
              if (ps == (ps_decoder_t *)0x0) {
                err_msg(ERR_FATAL,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_main.c"
                        ,0x224,"PocketSphinx decoder init failed\n");
                exit(1);
              }
              uVar14 = (ulong)(ninputs - 1);
              ptr = __ckd_malloc__(uVar14 * 4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_main.c"
                                   ,0x1fa);
              uVar11 = 0;
              iVar15 = 0;
              do {
                sVar6 = strlen(inputs[uVar11 + 1]);
                *(int *)((long)ptr + uVar11 * 4) = (int)sVar6;
                iVar15 = iVar15 + (int)sVar6 + 1;
                uVar11 = uVar11 + 1;
              } while (uVar14 != uVar11);
              pcVar9 = (char *)__ckd_malloc__((long)iVar15,
                                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_main.c"
                                              ,0x1ff);
              uVar11 = 0;
              pcVar4 = pcVar9;
              do {
                pcVar7 = pcVar4;
                memcpy(pcVar7,inputs[uVar11 + 1],(long)*(int *)((long)ptr + uVar11 * 4));
                iVar15 = *(int *)((long)ptr + uVar11 * 4);
                pcVar7[iVar15] = ' ';
                uVar11 = uVar11 + 1;
                pcVar4 = pcVar7 + iVar15 + 1;
              } while (uVar14 != uVar11);
              pcVar7[iVar15] = '\0';
              ckd_free(ptr);
              iVar3 = ps_set_align_text(ps,pcVar9);
              if (-1 < iVar3) {
                iVar3 = decode_single(ps,(FILE *)pFVar5);
              }
            }
          }
          else {
            pFVar5 = fopen(pcVar9,"rb");
            if (pFVar5 != (FILE *)0x0) goto LAB_00107ea3;
            iVar3 = 0;
            err_msg_system(ERR_ERROR,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_main.c"
                           ,0x21e,"Failed to open %s for input",*inputs);
            bVar1 = false;
            ps = (ps_decoder_t *)0x0;
            pcVar9 = (char *)0x0;
            pFVar5 = (FILE *)0x0;
          }
          if ((!bVar1) && (pFVar5 != (FILE *)0x0)) {
            fclose(pFVar5);
          }
          if (pcVar9 != (char *)0x0) {
            ckd_free(pcVar9);
          }
          if (ps != (ps_decoder_t *)0x0) {
            ps_free(ps);
          }
          goto LAB_00107dc4;
        }
        func = single;
      }
      iVar3 = process_inputs(func,config,inputs,ninputs);
      goto LAB_00107dc4;
    }
    pcVar9 = ps_config_serialize_json(config);
    iVar15 = puts(pcVar9);
    if (-1 < iVar15) {
      fflush(_stdout);
LAB_00107d42:
      iVar3 = 0;
      goto LAB_00107dc4;
    }
  }
LAB_00107d6e:
  iVar3 = -1;
LAB_00107dc4:
  ps_config_free(config);
  return iVar3;
}

Assistant:

int
main(int argc, char *argv[])
{
    ps_config_t *config;
    const char *conffile;
    char *command;
    char **inputs;
    int rv, ninputs;

    command = find_command(&argc, argv);
    inputs = find_inputs(&argc, argv, &ninputs);
    /* Only soxflags and config take no arguments */
    if (ninputs == 0) {
        if ((0 != strcmp(command, "soxflags"))
            && 0 != strcmp(command, "config")
            && 0 != strcmp(command, "help-config")) {
            usage(argv[0], FALSE);
            return 1;
        }
    }
    /* If arg parsing fails */
    if ((config = ps_config_parse_args(ps_main_args_def, argc, argv)) == NULL) {
        usage(argv[0], FALSE);
        return 1;
    }
    ps_default_search_args(config);
    if (ps_config_bool(config, "state_align"))
        ps_config_set_bool(config, "phone_align", TRUE);
    if ((conffile = ps_config_str(config, "config")) != NULL) {
        char *json;
        FILE *infh;
        size_t len;
        if ((infh = fopen(conffile, "rt")) == NULL) {
            E_ERROR_SYSTEM("Failed to open config file %s", conffile);
            return 1;
        }
        fseek(infh, 0, SEEK_END);
        len = (size_t)ftell(infh);
        fseek(infh, 0, SEEK_SET);
        json = ckd_malloc(len + 1);
        if (fread(json, 1, len, infh) != len) {
            E_ERROR_SYSTEM("Failed to read config file %s", conffile);
            ckd_free(json);
            fclose(infh);
            return 1;
        }
        json[len] = '\0';
        fclose(infh);
        config = ps_config_parse_json(config, json);
        ckd_free(json);
        if (config == NULL)
            return 1;
        ps_config_set_str(config, "config", NULL);
    }
    if (0 == strcmp(command, "soxflags"))
        rv = soxflags(config);
    else if (0 == strcmp(command, "config"))
        rv = print_config(config);
    else if (0 == strcmp(command, "live"))
        rv = process_inputs(live, config, inputs, ninputs);
    else if (0 == strcmp(command, "single"))
        rv = process_inputs(single, config, inputs, ninputs);
    else if (0 == strcmp(command, "align"))
        rv = align(config, inputs, ninputs);
    else if (0 == strcmp(command, "help")) {
        rv = 0;
        usage(argv[0], FALSE);
    }
    else if (0 == strcmp(command, "help-config")) {
        rv = 0;
        usage(argv[0], TRUE);
    }
    else {
        E_ERROR("Unknown command \"%s\"\n", command);
        return 1;
    }

    ps_config_free(config);
    return rv;
}